

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O3

void Imf_3_4::hufUncompress(char *compressed,int nCompressed,unsigned_short *raw,int nRaw)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  uint maxSymbol;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint64_t *hcode;
  void *__s;
  void *pvVar7;
  void *pvVar8;
  InputExc *pIVar9;
  sbyte sVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  uchar *b;
  ulong uVar15;
  uint uVar16;
  unsigned_short *puVar17;
  byte *pbVar18;
  ulong uVar19;
  long lVar20;
  int *piVar21;
  uint *puVar22;
  int *p;
  ulong uVar23;
  byte *pbVar24;
  char *ptr;
  FastHufDecoder fhd;
  byte *local_5410;
  char *local_5408;
  FastHufDecoder local_5400;
  
  if (nCompressed < 0x14) {
    if (nRaw == 0) {
      return;
    }
  }
  else {
    uVar5 = *(uint *)compressed;
    uVar15 = (ulong)uVar5;
    if ((0x10000 < uVar15) || (maxSymbol = *(uint *)(compressed + 4), 0x10000 < maxSymbol))
    goto LAB_0017e945;
    iVar3 = *(int *)(compressed + 0xc);
    pbVar18 = (byte *)(compressed + 0x14);
    uVar23 = (long)iVar3 + 7U >> 3;
    local_5408 = compressed + (long)(ulong)(uint)nCompressed;
    local_5410 = pbVar18;
    if (compressed + uVar23 + 0x14 <= local_5408) {
      bVar4 = FastHufDecoder::enabled();
      if (0x80 < iVar3 && bVar4) {
        FastHufDecoder::FastHufDecoder
                  (&local_5400,(char **)&local_5410,nCompressed + -0x14,uVar5,maxSymbol,maxSymbol);
        if (local_5410 + (uVar23 - (long)compressed) <= (byte *)(ulong)(uint)nCompressed) {
          FastHufDecoder::decode(&local_5400,local_5410,iVar3,raw,nRaw);
          FastHufDecoder::~FastHufDecoder(&local_5400);
          return;
        }
        anon_unknown_0::notEnoughData();
LAB_0017e97c:
        pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc
                  (pIVar9,"Error in header for Huffman-encoded data (invalid number of bits).");
        __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      hcode = (uint64_t *)operator_new__(0x80008);
      memset(hcode,0,0x80008);
      __s = operator_new__(0x40000);
      uVar6 = 0;
      memset(__s,0,0x40000);
      memset(hcode,0,0x80008);
      pbVar24 = pbVar18;
      if (uVar5 <= maxSymbol) {
        uVar19 = 0;
        uVar23 = uVar15;
        do {
          iVar14 = (int)uVar23;
          if ((long)(ulong)(nCompressed - 0x14) < (long)pbVar24 - (long)pbVar18) goto LAB_0017e936;
          uVar11 = uVar6;
          if ((int)uVar6 < 6) {
            do {
              bVar12 = *pbVar24;
              pbVar24 = pbVar24 + 1;
              uVar19 = uVar19 << 8 | (ulong)bVar12;
              uVar6 = uVar11 + 8;
              bVar4 = (int)uVar11 < -2;
              uVar11 = uVar6;
            } while (bVar4);
          }
          uVar11 = uVar6 - 6;
          uVar13 = (uint)(uVar19 >> ((byte)uVar11 & 0x3f)) & 0x3f;
          hcode[iVar14] = (ulong)uVar13;
          if ((ulong)uVar13 == 0x3f) {
            if ((long)(ulong)(nCompressed - 0x14) < (long)pbVar24 - (long)pbVar18)
            goto LAB_0017e936;
            if (uVar11 < 8) {
              uVar11 = uVar6 + 2;
              bVar12 = *pbVar24;
              pbVar24 = pbVar24 + 1;
              uVar19 = uVar19 << 8 | (ulong)bVar12;
            }
            uVar23 = uVar19 >> ((byte)(uVar11 - 8) & 0x3f);
            if ((int)(maxSymbol + 1) < (int)(((uint)uVar23 & 0xff) + iVar14 + 6)) goto LAB_0017e93b;
            uVar23 = uVar23 & 0xff;
            memset(hcode + iVar14,0,uVar23 * 8 + 0x30);
            iVar14 = iVar14 + (int)uVar23 + 5;
            uVar6 = uVar11 - 8;
          }
          else {
            uVar6 = uVar11;
            if (0x3a < uVar13) {
              if ((int)(maxSymbol + 1) < (int)(uVar13 + iVar14 + -0x39)) goto LAB_0017e93b;
              memset(hcode + iVar14,0,(ulong)(uVar13 - 0x39) << 3);
              iVar14 = iVar14 + uVar13 + -0x3a;
            }
          }
          uVar23 = (ulong)(iVar14 + 1);
        } while (iVar14 < (int)maxSymbol);
      }
      local_5410 = pbVar24;
      anon_unknown_0::hufCanonicalCodeTable(hcode);
      if (((long)local_5408 - (long)pbVar24) * 8 < (long)iVar3) goto LAB_0017e97c;
      if (uVar5 <= maxSymbol) {
        do {
          uVar23 = hcode[uVar15];
          uVar19 = uVar23 >> 6;
          uVar5 = (uint)uVar23 & 0x3f;
          sVar10 = (sbyte)uVar5;
          if (uVar19 >> sVar10 != 0) goto LAB_0017e927;
          if (uVar5 < 0xf) {
            if ((uVar23 & 0x3f) != 0) {
              uVar23 = (ulong)(uint)(1 << (0xeU - sVar10 & 0x1f));
              puVar22 = (uint *)((uVar19 << (0xeU - sVar10 & 0x3f)) * 0x10 + (long)__s);
              do {
                if (((char)*puVar22 != '\0') || (*(long *)(puVar22 + 2) != 0)) goto LAB_0017e927;
                *puVar22 = (int)uVar15 << 8 | uVar5;
                puVar22 = puVar22 + 4;
                uVar23 = uVar23 - 1;
              } while (uVar23 != 0);
            }
          }
          else {
            lVar20 = (uVar19 >> (sVar10 - 0xeU & 0x3f)) * 0x10;
            iVar14 = *(int *)((long)__s + lVar20);
            if ((char)iVar14 != '\0') goto LAB_0017e927;
            piVar21 = (int *)(lVar20 + (long)__s);
            iVar14 = iVar14 + 0x100;
            *piVar21 = iVar14;
            pvVar8 = *(void **)(piVar21 + 2);
            if (pvVar8 == (void *)0x0) {
              pvVar8 = operator_new__(4);
              *(void **)(piVar21 + 2) = pvVar8;
            }
            else {
              iVar14 = iVar14 >> 8;
              uVar23 = (long)iVar14 * 4;
              if (iVar14 < 0) {
                uVar23 = 0xffffffffffffffff;
              }
              pvVar7 = operator_new__(uVar23);
              *(void **)(piVar21 + 2) = pvVar7;
              if (1 < iVar14) {
                uVar23 = 0;
                do {
                  *(undefined4 *)((long)pvVar7 + uVar23 * 4) =
                       *(undefined4 *)((long)pvVar8 + uVar23 * 4);
                  uVar23 = uVar23 + 1;
                } while (iVar14 - 1 != uVar23);
              }
              operator_delete__(pvVar8);
              pvVar8 = *(void **)(piVar21 + 2);
              iVar14 = *piVar21;
            }
            *(int *)((long)pvVar8 + (long)(iVar14 >> 8) * 4 + -4) = (int)uVar15;
          }
          uVar15 = uVar15 + 1;
        } while (maxSymbol + 1 != (int)uVar15);
      }
      puVar1 = raw + nRaw;
      iVar14 = iVar3 + 0xe;
      if (-1 < iVar3 + 7) {
        iVar14 = iVar3 + 7;
      }
      puVar17 = raw;
      if (iVar3 < 1) {
        uVar5 = 0;
        uVar15 = 0;
      }
      else {
        pbVar18 = pbVar24 + (iVar14 >> 3);
        uVar15 = 0;
        uVar5 = 0;
        do {
          bVar12 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar15 = (ulong)bVar12 | uVar15 << 8;
          uVar6 = uVar5 + 8;
          bVar4 = 5 < (int)uVar5;
          uVar5 = uVar6;
          if (bVar4) {
            do {
              uVar23 = (ulong)(((uint)(uVar15 >> ((char)uVar5 - 0xeU & 0x3f)) & 0x3fff) << 4);
              iVar14 = *(int *)((long)__s + uVar23);
              uVar6 = iVar14 >> 8;
              if (iVar14 << 0x18 == 0) {
                lVar20 = *(long *)((long)__s + uVar23 + 8);
                if (lVar20 == 0) goto LAB_0017e922;
                if ((int)uVar6 < 1) {
                  uVar23 = 0;
                }
                else {
                  uVar23 = 0;
                  while( true ) {
                    uVar11 = *(uint *)(lVar20 + uVar23 * 4);
                    uVar13 = (uint)hcode[(int)uVar11] & 0x3f;
                    for (; ((int)uVar5 < (int)uVar13 && (pbVar24 < pbVar18)); pbVar24 = pbVar24 + 1)
                    {
                      uVar15 = (ulong)*pbVar24 | uVar15 << 8;
                      uVar5 = uVar5 + 8;
                    }
                    if (((int)uVar13 <= (int)uVar5) &&
                       (uVar16 = uVar5 - uVar13,
                       hcode[(int)uVar11] >> 6 ==
                       (~(-1L << (sbyte)uVar13) & uVar15 >> ((byte)uVar16 & 0x3f)))) break;
                    uVar23 = uVar23 + 1;
                    if (uVar23 == uVar6) goto LAB_0017e922;
                  }
                  if (uVar11 == maxSymbol) {
                    if ((int)uVar16 < 8) {
                      bVar12 = *pbVar24;
                      pbVar24 = pbVar24 + 1;
                      uVar15 = uVar15 << 8 | (ulong)bVar12;
                      uVar16 = uVar16 + 8;
                    }
                    uVar5 = uVar16 - 8;
                    uVar19 = uVar15 >> ((byte)uVar5 & 0x3f);
                    if (puVar1 < puVar17 + (uVar19 & 0xff)) goto LAB_0017e92c;
                    if (puVar17 + -1 < raw) goto LAB_0017e931;
                    if ((char)uVar19 != '\0') {
                      uVar2 = puVar17[-1];
                      do {
                        *puVar17 = uVar2;
                        puVar17 = puVar17 + 1;
                        bVar12 = (char)uVar19 - 1;
                        uVar19 = (ulong)bVar12;
                      } while (bVar12 != 0);
                    }
                  }
                  else {
                    if (puVar1 <= puVar17) goto LAB_0017e92c;
                    *puVar17 = (unsigned_short)uVar11;
                    puVar17 = puVar17 + 1;
                    uVar5 = uVar16;
                  }
                }
                if ((uint)uVar23 == uVar6) goto LAB_0017e922;
              }
              else {
                uVar5 = uVar5 - ((iVar14 << 0x18) >> 0x18);
                if ((int)uVar5 < 0) goto LAB_0017e922;
                if (uVar6 == maxSymbol) {
                  if (uVar5 < 8) {
                    bVar12 = *pbVar24;
                    pbVar24 = pbVar24 + 1;
                    uVar15 = uVar15 << 8 | (ulong)bVar12;
                    uVar5 = uVar5 | 8;
                  }
                  uVar5 = uVar5 - 8;
                  uVar23 = uVar15 >> ((byte)uVar5 & 0x3f);
                  if (puVar1 < puVar17 + (uVar23 & 0xff)) goto LAB_0017e92c;
                  if (puVar17 + -1 < raw) goto LAB_0017e931;
                  if ((char)uVar23 != '\0') {
                    uVar2 = puVar17[-1];
                    do {
                      *puVar17 = uVar2;
                      puVar17 = puVar17 + 1;
                      bVar12 = (char)uVar23 - 1;
                      uVar23 = (ulong)bVar12;
                    } while (bVar12 != 0);
                  }
                }
                else {
                  if (puVar1 <= puVar17) goto LAB_0017e92c;
                  *puVar17 = (unsigned_short)((uint)iVar14 >> 8);
                  puVar17 = puVar17 + 1;
                }
              }
            } while (0xd < (int)uVar5);
          }
        } while (pbVar24 < pbVar18);
      }
      uVar11 = -iVar3 & 7;
      uVar6 = uVar5 - uVar11;
      if (uVar6 != 0 && (int)uVar11 <= (int)uVar5) {
        uVar15 = uVar15 >> (sbyte)uVar11;
        do {
          iVar3 = *(int *)((long)__s +
                          (ulong)(((uint)(uVar15 << (0xeU - (char)uVar6 & 0x3f)) & 0x3fff) << 4));
          if ((iVar3 << 0x18 == 0) || (uVar6 = uVar6 - ((iVar3 << 0x18) >> 0x18), (int)uVar6 < 0))
          goto LAB_0017e922;
          if (iVar3 >> 8 == maxSymbol) {
            if (uVar6 < 8) {
              bVar12 = *pbVar24;
              pbVar24 = pbVar24 + 1;
              uVar15 = uVar15 << 8 | (ulong)bVar12;
              uVar6 = uVar6 | 8;
            }
            uVar6 = uVar6 - 8;
            uVar23 = uVar15 >> ((byte)uVar6 & 0x3f);
            if (puVar1 < puVar17 + (uVar23 & 0xff)) goto LAB_0017e92c;
            if (puVar17 + -1 < raw) goto LAB_0017e931;
            if ((char)uVar23 != '\0') {
              uVar2 = puVar17[-1];
              do {
                *puVar17 = uVar2;
                puVar17 = puVar17 + 1;
                bVar12 = (char)uVar23 - 1;
                uVar23 = (ulong)bVar12;
              } while (bVar12 != 0);
            }
          }
          else {
            if (puVar1 <= puVar17) goto LAB_0017e92c;
            *puVar17 = (unsigned_short)((uint)iVar3 >> 8);
            puVar17 = puVar17 + 1;
          }
        } while (0 < (int)uVar6);
      }
      if ((long)puVar17 - (long)raw >> 1 == (long)nRaw) {
        lVar20 = 8;
        do {
          if (*(void **)((long)__s + lVar20) != (void *)0x0) {
            operator_delete__(*(void **)((long)__s + lVar20));
            *(undefined8 *)((long)__s + lVar20) = 0;
          }
          lVar20 = lVar20 + 0x10;
        } while (lVar20 != 0x40008);
        operator_delete__(__s);
        operator_delete__(hcode);
        return;
      }
      goto LAB_0017e931;
    }
  }
  goto LAB_0017e940;
LAB_0017e922:
  anon_unknown_0::invalidCode();
LAB_0017e927:
  anon_unknown_0::invalidTableEntry();
LAB_0017e92c:
  anon_unknown_0::tooMuchData();
LAB_0017e931:
  anon_unknown_0::notEnoughData();
LAB_0017e936:
  anon_unknown_0::unexpectedEndOfTable();
LAB_0017e93b:
  anon_unknown_0::tableTooLong();
LAB_0017e940:
  anon_unknown_0::notEnoughData();
LAB_0017e945:
  pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(pIVar9,"Error in Huffman-encoded data (invalid code table size).");
  __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

void
hufUncompress (
    const char compressed[], int nCompressed, unsigned short raw[], int nRaw)
{
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) notEnoughData ();

        return;
    }

    int im = readUInt (compressed);
    int iM = readUInt (compressed + 4);
    // int tableLength = readUInt (compressed + 8);
    int nBits = readUInt (compressed + 12);

    if (im < 0 || im >= HUF_ENCSIZE || iM < 0 || iM >= HUF_ENCSIZE)
        invalidTableSize ();

    const char* ptr = compressed + 20;

    uint64_t nBytes = (static_cast<uint64_t> (nBits) + 7) / 8;

    if (ptr + nBytes > compressed + nCompressed)
    {
        notEnoughData ();
        return;
    }

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //

    if (FastHufDecoder::enabled () && nBits > 128)
    {
        FastHufDecoder fhd (ptr, nCompressed - (ptr - compressed), im, iM, iM);

        // must be nBytes remaining in buffer
        if (ptr - compressed + nBytes > static_cast<uint64_t> (nCompressed))
        {
            notEnoughData ();
            return;
        }

        fhd.decode ((unsigned char*) ptr, nBits, raw, nRaw);
    }
    else
    {
        AutoArray<uint64_t, HUF_ENCSIZE> freq;
        AutoArray<HufDec, HUF_DECSIZE>   hdec;

        hufClearDecTable (hdec);

        hufUnpackEncTable (
            &ptr, nCompressed - (ptr - compressed), im, iM, freq);

        try
        {
            if (nBits > 8 * (nCompressed - (ptr - compressed))) invalidNBits ();

            hufBuildDecTable (freq, im, iM, hdec);
            hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);
        }
        catch (...)
        {
            hufFreeDecTable (hdec);
            throw;
        }

        hufFreeDecTable (hdec);
    }
}